

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::CalcStiffT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this,
          TPZElementMatrixT<std::complex<double>_> *ek,TPZElementMatrixT<std::complex<double>_> *ef)

{
  long lVar1;
  TPZElementMatrixT<std::complex<double>_> *pTVar2;
  TPZElementMatrixT<std::complex<double>_> *pTVar3;
  int64_t iVar4;
  _func_int **pp_Var5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long *plVar11;
  TPZIntPoints *rval;
  uint uVar12;
  long lVar13;
  long lVar14;
  TPZCompElSide *pTVar15;
  int *piVar16;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  TPZManVector<double,_4> intpointtemp;
  REAL detJac;
  TPZManVector<int,_4> intorder;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> datavec;
  TPZAutoPointer<TPZIntPoints> TStack_40540;
  TPZElementMatrixT<std::complex<double>_> *pTStack_40538;
  TPZElementMatrixT<std::complex<double>_> *pTStack_40530;
  int iStack_40524;
  double dStack_40520;
  undefined **ppuStack_40518;
  TPZGeoEl *pTStack_40510;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *pTStack_40508;
  TPZManVector<int,_4> TStack_40500;
  undefined **ppuStack_404d0;
  long *plStack_404c8;
  TPZVec<double> TStack_404c0;
  double adStack_404a0 [4];
  _func_int **pp_Stack_40480;
  double dStack_40478;
  TPZManVector<int,_4> TStack_40470;
  TPZFMatrix<double> TStack_40440;
  TPZFMatrix<double> TStack_403b0;
  TPZFMatrix<double> TStack_40320;
  TPZManVector<TPZTransform<double>,_10> TStack_40290;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> TStack_3f230;
  
  pTStack_40538 = ek;
  pTStack_40530 = ef;
  lVar10 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))();
  if (lVar10 == 0) {
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = (long *)__dynamic_cast(lVar10,&TPZMaterial::typeinfo,
                                     &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                     0xfffffffffffffffe);
  }
  if (lVar10 == 0 || plVar11 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "void TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::CalcStiffT(TPZElementMatrixT<TVar> &, TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoLinear, TVar = std::complex<double>]"
               ,0xb2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
    TPZElementMatrixT<std::complex<double>_>::Reset(pTStack_40538,(TPZCompMesh *)0x0,Unknown);
    TPZElementMatrixT<std::complex<double>_>::Reset(pTStack_40530,(TPZCompMesh *)0x0,Unknown);
    return;
  }
  lVar10 = __dynamic_cast(lVar10,&TPZMaterial::typeinfo,
                          &TPZNullMaterialCS<std::complex<double>>::typeinfo,0);
  pTVar2 = pTStack_40538;
  if (lVar10 == 0) {
    (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xf8))
              (this,pTStack_40538,pTStack_40530);
    iVar6 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                      (this);
    if (iVar6 != 0) {
      TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::TPZManVector(&TStack_3f230,0);
      lVar10 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      (*TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>._vptr_TPZVec[3])
                (&TStack_3f230,lVar10);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x290))
                (this,&TStack_3f230,0);
      TPZManVector<TPZTransform<double>,_10>::TPZManVector(&TStack_40290,0);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))(this);
      iVar6 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                        (this);
      TStack_40540.fRef = (TPZReference *)operator_new(0x10);
      (TStack_40540.fRef)->fPointer = (TPZIntPoints *)0x0;
      ((TStack_40540.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
      LOCK();
      ((TStack_40540.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
      UNLOCK();
      plStack_404c8 = plVar11;
      TPZVec<double>::TPZVec(&TStack_404c0,0);
      TStack_404c0.fStore = adStack_404a0;
      ppuStack_404d0 = &PTR__TPZManVector_018a32e0;
      TStack_404c0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a32e0;
      TStack_404c0.fNElements = 1;
      TStack_404c0.fNAlloc = 0;
      adStack_404a0[0] = 0.0;
      dStack_40520 = 0.0;
      TPZVec<int>::TPZVec(&TStack_40500.super_TPZVec<int>,0);
      TStack_40500.super_TPZVec<int>.fStore = TStack_40500.fExtAlloc;
      ppuStack_40518 = &PTR__TPZManVector_018e5370;
      TStack_40500.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5370;
      TStack_40500.super_TPZVec<int>.fNElements = 0;
      TStack_40500.super_TPZVec<int>.fNAlloc = 0;
      pTStack_40508 = this;
      if (0 < lVar10) {
        lVar13 = 17000;
        lVar14 = 0;
        do {
          lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                           lVar14);
          if (lVar1 == 0) {
            plVar11 = (long *)0x0;
          }
          else {
            plVar11 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                             &TPZInterpolationSpace::typeinfo,0);
          }
          if (plVar11 != (long *)0x0) {
            TPZManVector<int,_4>::Resize
                      (&TStack_40500,TStack_40500.super_TPZVec<int>.fNElements + 1);
            iVar4 = TStack_40500.super_TPZVec<int>.fNElements;
            uVar7 = (**(code **)(*plVar11 + 0x268))(plVar11);
            *(undefined4 *)
             ((long)((TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.fStore)->
                    super_TPZMaterialData).super_TPZShapeData.fCornerNodeIds.fExtAlloc +
             lVar13 + -0x30) = uVar7;
            *(undefined4 *)
             ((long)TStack_40500.super_TPZVec<int>.fStore + ((iVar4 << 0x20) + -0x100000000 >> 0x1e)
             ) = uVar7;
            this = pTStack_40508;
          }
          lVar14 = lVar14 + 0x10;
          lVar13 = lVar13 + 0xa850;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      iStack_40524 = (**(code **)(*plStack_404c8 + 0x48))(plStack_404c8,&TStack_40500);
      pTStack_40510 = TPZCompEl::Reference((TPZCompEl *)this);
      iVar8 = (**(code **)(*(long *)pTStack_40510 + 0xf0))();
      rval = (TPZIntPoints *)
             (**(code **)(*(long *)pTStack_40510 + 0x70))(pTStack_40510,iVar8 + -1,iStack_40524);
      TPZAutoPointer<TPZIntPoints>::operator=(&TStack_40540,rval);
      TPZManVector<int,_4>::TPZManVector(&TStack_40470,(long)iVar6,&iStack_40524);
      (*(TStack_40540.fRef)->fPointer->_vptr_TPZIntPoints[5])
                ((TStack_40540.fRef)->fPointer,&TStack_40470,0);
      uVar9 = (*(TStack_40540.fRef)->fPointer->_vptr_TPZIntPoints[3])();
      if (1000 < (int)uVar9) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                   ,0x36d);
      }
      TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_40320.fElem = (double *)0x0;
      TStack_40320.fGiven = (double *)0x0;
      TStack_40320.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_40320.fPivot.super_TPZVec<int>,0);
      TStack_40320.fPivot.super_TPZVec<int>.fStore = TStack_40320.fPivot.fExtAlloc;
      TStack_40320.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_40320.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_40320.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_40320.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_40320.fWork.fStore = (double *)0x0;
      TStack_40320.fWork.fNElements = 0;
      TStack_40320.fWork.fNAlloc = 0;
      TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_403b0.fElem = (double *)0x0;
      TStack_403b0.fGiven = (double *)0x0;
      TStack_403b0.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_403b0.fPivot.super_TPZVec<int>,0);
      TStack_403b0.fPivot.super_TPZVec<int>.fStore = TStack_403b0.fPivot.fExtAlloc;
      TStack_403b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_403b0.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_403b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_403b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_403b0.fWork.fStore = (double *)0x0;
      TStack_403b0.fWork.fNElements = 0;
      TStack_403b0.fWork.fNAlloc = 0;
      TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_40440.fElem = (double *)0x0;
      TStack_40440.fGiven = (double *)0x0;
      TStack_40440.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_40440.fPivot.super_TPZVec<int>,0);
      TStack_40440.fPivot.super_TPZVec<int>.fStore = TStack_40440.fPivot.fExtAlloc;
      TStack_40440.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_40440.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_40440.fPivot.super_TPZVec<int>.fNAlloc = 0;
      pp_Stack_40480 = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_40440.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_40440.fWork.fStore = (double *)0x0;
      TStack_40440.fWork.fNElements = 0;
      TStack_40440.fWork.fNAlloc = 0;
      if (0 < (int)uVar9) {
        pTStack_40538 = (TPZElementMatrixT<std::complex<double>_> *)&pTStack_40538->fMat;
        pTStack_40530 = (TPZElementMatrixT<std::complex<double>_> *)&pTStack_40530->fMat;
        uVar12 = 0;
        do {
          (*(TStack_40540.fRef)->fPointer->_vptr_TPZIntPoints[4])
                    ((TStack_40540.fRef)->fPointer,(ulong)uVar12,&TStack_404c0,&dStack_40520);
          TPZGeoEl::Jacobian(pTStack_40510,&TStack_404c0,&TStack_40320,&TStack_403b0,&dStack_40478,
                             &TStack_40440);
          dStack_40520 = ABS(dStack_40478) * dStack_40520;
          lVar10 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
          if (0 < lVar10) {
            pTVar15 = (pTStack_40508->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
            piVar16 = &((TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.fStore)
                       ->super_TPZMaterialData).intLocPtIndex;
            do {
              if (pTVar15->fEl != (TPZCompEl *)0x0) {
                lVar13 = __dynamic_cast(pTVar15->fEl,&TPZCompEl::typeinfo,
                                        &TPZInterpolationSpace::typeinfo,0);
                if (lVar13 != 0) {
                  *piVar16 = uVar12;
                }
              }
              piVar16 = piVar16 + 0x2a14;
              pTVar15 = pTVar15 + 1;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          this = pTStack_40508;
          (**(code **)(*(long *)&(pTStack_40508->super_TPZMultiphysicsElement).super_TPZCompEl +
                      0x2b0))(pTStack_40508,&TStack_404c0,&TStack_40290,&TStack_3f230);
          (**(code **)(*plStack_404c8 + 0x68))
                    (dStack_40520,plStack_404c8,&TStack_3f230,pTStack_40538,pTStack_40530);
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      CleanupMaterialDataT<std::complex<double>>
                (this,&TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_40440);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_403b0);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_40320);
      if (TStack_40470.super_TPZVec<int>.fStore == TStack_40470.fExtAlloc) {
        TStack_40470.super_TPZVec<int>.fStore = (int *)0x0;
      }
      TStack_40470.super_TPZVec<int>.fNAlloc = 0;
      TStack_40470.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (TStack_40470.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(TStack_40470.super_TPZVec<int>.fStore);
      }
      pp_Var5 = pp_Stack_40480;
      if (TStack_40500.super_TPZVec<int>.fStore == TStack_40500.fExtAlloc) {
        TStack_40500.super_TPZVec<int>.fStore = (int *)0x0;
      }
      TStack_40500.super_TPZVec<int>.fNAlloc = 0;
      TStack_40500.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (TStack_40500.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(TStack_40500.super_TPZVec<int>.fStore);
      }
      if (TStack_404c0.fStore == adStack_404a0) {
        TStack_404c0.fStore = (double *)0x0;
      }
      TStack_404c0.fNAlloc = 0;
      TStack_404c0._vptr_TPZVec = pp_Var5;
      if (TStack_404c0.fStore != (double *)0x0) {
        operator_delete__(TStack_404c0.fStore);
      }
      TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&TStack_40540);
      TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&TStack_40290);
      TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::~TPZManVector(&TStack_3f230);
    }
  }
  else {
    TPZElementMatrixT<std::complex<double>_>::Reset(pTStack_40538,(TPZCompMesh *)0x0,Unknown);
    pTVar3 = pTStack_40530;
    TPZElementMatrixT<std::complex<double>_>::Reset(pTStack_40530,(TPZCompMesh *)0x0,Unknown);
    (pTVar2->super_TPZElementMatrix).fType = EK;
    (pTVar3->super_TPZElementMatrix).fType = EF;
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcStiffT(TPZElementMatrixT<TVar> &ek, TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ek.Reset();
        ef.Reset();
        return;
    }
    
    auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(material);
    if(nullmat)
    {
        ek.Reset();
        ef.Reset();
        ek.fType = TPZElementMatrix::EK;
        ef.fType = TPZElementMatrix::EF;
        return;
    }
    InitializeElementMatrix(ek,ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,6> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,4> intpointtemp(TGeometry::Dimension,0.);
    REAL weight = 0.;
    
    TPZManVector<int,4> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,4> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int i = 0; i < fElementVec.size(); i++) {
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[i].Element());
            if (!msp) {
                continue;
            }
            datavec[i].intLocPtIndex = int_ind;
        }
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ek.fMat,ef.fMat);
    }//loop over integration points
    
    CleanupMaterialData(datavec);
}